

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdRaycastMesh.cpp
# Opt level: O2

void __thiscall
HACD::RMNode::Create(RMNode *this,size_t depth,size_t maxDepth,size_t minLeafSize,Float minAxisSize)

{
  RMNode *this_00;
  Vec3<long> *pVVar1;
  BBox *this_01;
  BBox *this_02;
  undefined1 auVar2 [16];
  RaycastMesh *pRVar3;
  size_t sVar4;
  RMNode *pRVar5;
  Vec3<long> *pVVar6;
  Vec3<double> *pVVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  int k;
  SArray<long,_16UL> *pSVar12;
  long lVar13;
  size_t id;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  long f;
  long local_50;
  long local_48 [3];
  
  ComputeBB(this);
  if ((depth != maxDepth) && (minLeafSize < (this->m_triIDs).m_size)) {
    dVar11 = (this->m_bBox).m_max.m_data[0] - (this->m_bBox).m_min.m_data[0];
    auVar10 = vsubpd_avx(*(undefined1 (*) [16])((this->m_bBox).m_max.m_data + 1),
                         *(undefined1 (*) [16])((this->m_bBox).m_min.m_data + 1));
    auVar9 = vshufpd_avx(auVar10,auVar10,1);
    auVar15 = vmaxsd_avx(auVar9,auVar10);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar11;
    auVar15 = vmaxsd_avx(auVar15,auVar16);
    dVar17 = auVar15._0_8_;
    if (minAxisSize <= dVar17) {
      pRVar3 = this->m_rm;
      sVar4 = pRVar3->m_nNodes;
      this->m_idLeft = sVar4;
      pRVar3->m_nNodes = sVar4 + 2;
      this->m_idRight = sVar4 + 1;
      pRVar5 = pRVar3->m_nodes;
      this_01 = &pRVar5[sVar4].m_bBox;
      this_00 = pRVar5 + sVar4;
      *(size_t *)((long)(this_01 + -1) + 0x18) = sVar4;
      *(size_t *)((long)(this_01 + 4) + 0x18) = sVar4 + 1;
      BBox::operator=(this_01,&this->m_bBox);
      this_02 = &pRVar5[sVar4 + 1].m_bBox;
      BBox::operator=(this_02,&this->m_bBox);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = dVar11;
      pRVar3 = this->m_rm;
      *(RaycastMesh **)((long)(this_02 + -1) + 8) = pRVar3;
      *(RaycastMesh **)((long)(this_02 + 4) + 8) = pRVar3;
      if ((dVar11 != dVar17) || (NAN(dVar11) || NAN(dVar17))) {
        if ((auVar10._0_8_ != dVar17) || (NAN(auVar10._0_8_) || NAN(dVar17))) {
          auVar10._8_8_ = 0;
          auVar10._0_8_ = (this_00->m_bBox).m_max.m_data[2];
          auVar15 = vfmadd213sd_fma(ZEXT816(0xbfe0000000000000),auVar9,auVar10);
          (this_00->m_bBox).m_max.m_data[2] = auVar15._0_8_;
          this_00[1].m_bBox.m_min.m_data[2] = auVar15._0_8_;
        }
        else {
          auVar9._8_8_ = 0;
          auVar9._0_8_ = (this_00->m_bBox).m_max.m_data[1];
          auVar15 = vfmadd213sd_fma(ZEXT816(0xbfe0000000000000),auVar10,auVar9);
          (this_00->m_bBox).m_max.m_data[1] = auVar15._0_8_;
          this_00[1].m_bBox.m_min.m_data[1] = auVar15._0_8_;
        }
      }
      else {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (this_00->m_bBox).m_max.m_data[0];
        auVar15 = vfmadd213sd_fma(ZEXT816(0xbfe0000000000000),auVar15,auVar2);
        (this_00->m_bBox).m_max.m_data[0] = auVar15._0_8_;
        (this_02->m_min).m_data[0] = auVar15._0_8_;
      }
      pVVar6 = this->m_rm->m_triangles;
      pVVar7 = this->m_rm->m_vertices;
      SArray<long,_16UL>::Resize(&this_00->m_triIDs,(this->m_triIDs).m_size);
      SArray<long,_16UL>::Resize(&this_00[1].m_triIDs,(this->m_triIDs).m_size);
      uVar14 = 0;
LAB_00d84323:
      if ((this->m_triIDs).m_size <= uVar14) {
        Create(this_00 + 1,depth + 1,maxDepth,minLeafSize,minAxisSize);
        Create(this_00,depth + 1,maxDepth,minLeafSize,minAxisSize);
        SArray<long,_16UL>::Clear(&this->m_triIDs);
        return;
      }
      pSVar12 = &this->m_triIDs;
      if ((this->m_triIDs).m_maxSize != 0x10) {
        pSVar12 = (SArray<long,_16UL> *)(this->m_triIDs).m_data;
      }
      local_50 = pSVar12->m_data0[uVar14];
      pVVar1 = pVVar6 + local_50;
      local_48[0] = pVVar1->m_data[0];
      local_48[1] = pVVar1->m_data[1];
      local_48[2] = pVVar6[local_50].m_data[2];
      for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
        lVar8 = local_48[lVar13];
        if ((((pVVar7[lVar8].m_data[0] <= (this_00->m_bBox).m_max.m_data[0]) &&
             ((this_01->m_min).m_data[0] <= pVVar7[lVar8].m_data[0])) &&
            (pVVar7[lVar8].m_data[1] <= (this_00->m_bBox).m_max.m_data[1])) &&
           ((((this_00->m_bBox).m_min.m_data[1] <= pVVar7[lVar8].m_data[1] &&
             (pVVar7[lVar8].m_data[2] <= (this_00->m_bBox).m_max.m_data[2])) &&
            (pSVar12 = &this_00->m_triIDs,
            (this_00->m_bBox).m_min.m_data[2] <= pVVar7[lVar8].m_data[2])))) goto LAB_00d84435;
      }
      for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
        lVar8 = local_48[lVar13];
        if (((pVVar7[lVar8].m_data[0] <= this_00[1].m_bBox.m_max.m_data[0]) &&
            ((this_02->m_min).m_data[0] <= pVVar7[lVar8].m_data[0])) &&
           ((pVVar7[lVar8].m_data[1] <= this_00[1].m_bBox.m_max.m_data[1] &&
            (((this_00[1].m_bBox.m_min.m_data[1] <= pVVar7[lVar8].m_data[1] &&
              (pVVar7[lVar8].m_data[2] <= this_00[1].m_bBox.m_max.m_data[2])) &&
             (pSVar12 = &this_00[1].m_triIDs,
             this_00[1].m_bBox.m_min.m_data[2] <= pVVar7[lVar8].m_data[2])))))) goto LAB_00d84435;
      }
      goto LAB_00d84443;
    }
  }
  this->m_leaf = true;
  return;
LAB_00d84435:
  SArray<long,_16UL>::PushBack(pSVar12,&local_50);
LAB_00d84443:
  uVar14 = uVar14 + 1;
  goto LAB_00d84323;
}

Assistant:

void RMNode::Create(size_t depth, size_t maxDepth, size_t minLeafSize, Float minAxisSize)
	{
		ComputeBB();
		Vec3<Float> d = m_bBox.m_max - m_bBox.m_min;
		Float maxDiff = std::max<Float>(d.X(), std::max<Float>(d.Y(), d.Z()));
		RMSplitAxis split;
		if		(d.X() == maxDiff) split = RMSplitAxis_X;
		else if (d.Y() == maxDiff) split = RMSplitAxis_Y;
		else					   split = RMSplitAxis_Z;
	
		if (depth == maxDepth || minLeafSize >= m_triIDs.Size() || maxDiff < minAxisSize)
		{
			m_leaf = true;
			return;
		}
		m_idLeft  = (long)m_rm->AddNode();
		m_idRight = (long)m_rm->AddNode();
		RMNode & leftNode  = m_rm->m_nodes[m_idLeft];	
		RMNode & rightNode = m_rm->m_nodes[m_idRight];
		leftNode.m_id      = m_idLeft;
		rightNode.m_id     = m_idRight;
		leftNode.m_bBox    = m_bBox;
		rightNode.m_bBox   = m_bBox;
		leftNode.m_rm	   = m_rm;
		rightNode.m_rm	   = m_rm;

		if ( split == RMSplitAxis_X)
		{
			leftNode.m_bBox.m_max.X() = leftNode.m_bBox.m_max.X() - d.X() * 0.5;
			rightNode.m_bBox.m_min.X() = leftNode.m_bBox.m_max.X();
		}
		else if ( split == RMSplitAxis_Y)
		{
			leftNode.m_bBox.m_max.Y() = leftNode.m_bBox.m_max.Y() - d.Y() * 0.5;
			rightNode.m_bBox.m_min.Y() = leftNode.m_bBox.m_max.Y();
		}
		else
		{
			leftNode.m_bBox.m_max.Z() = leftNode.m_bBox.m_max.Z() - d.Z() * 0.5;
			rightNode.m_bBox.m_min.Z() = leftNode.m_bBox.m_max.Z();
		}
		long f;
		long pts[3];
		long v;
		Vec3<long> * const triangles = m_rm->m_triangles;			
		Vec3<Float> * const vertices = m_rm->m_vertices;
		leftNode.m_triIDs.Resize(m_triIDs.Size());
		rightNode.m_triIDs.Resize(m_triIDs.Size());
		bool found;
		for(size_t id = 0; id < m_triIDs.Size(); ++id)
		{
			f = m_triIDs[id];
			pts[0] = triangles[f].X();
            pts[1] = triangles[f].Y();
            pts[2] = triangles[f].Z();

			found = false;
			for (int k = 0; k < 3; ++k)
			{
				v = pts[k];
				if ( vertices[v].X() <= leftNode.m_bBox.m_max.X() && 
					 vertices[v].X() >= leftNode.m_bBox.m_min.X() &&
					 vertices[v].Y() <= leftNode.m_bBox.m_max.Y() && 
					 vertices[v].Y() >= leftNode.m_bBox.m_min.Y() &&
					 vertices[v].Z() <= leftNode.m_bBox.m_max.Z() && 
					 vertices[v].Z() >= leftNode.m_bBox.m_min.Z() )
				{
					leftNode.m_triIDs.PushBack(f);
					found = true;
					break;
				}
			}
			if (!found)
			{
				for (int k = 0; k < 3; ++k)
				{
					v = pts[k];
					if ( vertices[v].X() <= rightNode.m_bBox.m_max.X() && 
						 vertices[v].X() >= rightNode.m_bBox.m_min.X() &&
						 vertices[v].Y() <= rightNode.m_bBox.m_max.Y() && 
						 vertices[v].Y() >= rightNode.m_bBox.m_min.Y() &&
						 vertices[v].Z() <= rightNode.m_bBox.m_max.Z() && 
						 vertices[v].Z() >= rightNode.m_bBox.m_min.Z() )
					{
						rightNode.m_triIDs.PushBack(f);
						break;
					}
				}		
			}
		}
		rightNode.Create(depth+1, maxDepth, minLeafSize, minAxisSize);
		leftNode.Create(depth+1, maxDepth, minLeafSize, minAxisSize);
		m_triIDs.Clear();
	}